

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O1

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  undefined1 auVar15 [16];
  int *piVar16;
  int iVar17;
  void *pvVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  void *pvVar22;
  long lVar23;
  void *pvVar24;
  uint *puVar25;
  long lVar26;
  long lVar27;
  void *pvVar28;
  undefined4 uVar29;
  void *pvVar30;
  void *pvVar31;
  void *pvVar32;
  long lVar33;
  void *pvVar34;
  long lVar35;
  void *pvVar36;
  short tmp [6] [3];
  void *local_170;
  void *local_160;
  long local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  void *local_138;
  void *local_130;
  void *local_128;
  Mat local_f8;
  long local_b0;
  long local_a8;
  void *local_a0;
  ulong local_98;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  void *local_70;
  void *local_68;
  undefined8 local_60;
  short sStack_58;
  uint auStack_56 [9];
  
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  Mat::create(&local_f8,0x24,inch,outch,2,(Allocator *)0x0);
  if (0 < outch) {
    pvVar22 = kernel->data;
    local_160 = local_f8.data;
    local_170 = (void *)0x0;
    do {
      if (0 < inch) {
        iVar17 = inch * 9 * (int)local_170;
        uVar19 = 0;
        pvVar24 = local_160;
        do {
          lVar23 = uVar19 * 9;
          cVar1 = *(char *)((long)pvVar22 + lVar23 + iVar17);
          cVar2 = *(char *)((long)pvVar22 + lVar23 + (long)iVar17 + 1);
          cVar3 = *(char *)((long)pvVar22 + lVar23 + (long)iVar17 + 2);
          cVar4 = *(char *)((long)pvVar22 + lVar23 + (long)iVar17 + 3);
          cVar5 = *(char *)((long)pvVar22 + lVar23 + (long)iVar17 + 4);
          cVar6 = *(char *)((long)pvVar22 + lVar23 + (long)iVar17 + 5);
          cVar7 = *(char *)((long)pvVar22 + lVar23 + (long)iVar17 + 6);
          cVar8 = *(char *)((long)pvVar22 + lVar23 + (long)iVar17 + 7);
          cVar9 = *(char *)((long)pvVar22 + lVar23 + (long)iVar17 + 8);
          lVar23 = 4;
          do {
            sVar10 = *(short *)(&UNK_0055166c + lVar23);
            sVar11 = *(short *)(&UNK_0055166e + lVar23);
            sVar12 = *(short *)((long)&DAT_00551670 + lVar23);
            *(short *)((long)&local_60 + lVar23 + 4) =
                 sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
            *(short *)((long)&local_60 + lVar23 + 6) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)auStack_56 + lVar23 + -2) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
            lVar23 = lVar23 + 6;
          } while (lVar23 != 0x28);
          lVar23 = 0;
          pvVar18 = pvVar24;
          do {
            sVar10 = *(short *)((long)auStack_56 + lVar23 * 6 + -2);
            uVar13 = *(uint *)((long)auStack_56 + lVar23 * 6);
            puVar25 = &DAT_00551672;
            lVar26 = 0;
            do {
              auVar15 = vpmullw_avx(ZEXT416(*puVar25),ZEXT416(uVar13));
              uVar29 = vpextrw_avx(auVar15,1);
              *(short *)((long)pvVar18 + lVar26 * 2) =
                   (short)uVar29 + auVar15._0_2_ + *(short *)((long)puVar25 + -2) * sVar10;
              lVar26 = lVar26 + 1;
              puVar25 = (uint *)((long)puVar25 + 6);
            } while (lVar26 != 6);
            lVar23 = lVar23 + 1;
            pvVar18 = (void *)((long)pvVar18 + 0xc);
          } while (lVar23 != 6);
          uVar19 = uVar19 + 1;
          pvVar24 = (void *)((long)pvVar24 + (long)local_f8.w * local_f8.elemsize);
        } while (uVar19 != (uint)inch);
      }
      local_170 = (void *)((long)local_170 + 1);
      local_160 = (void *)((long)local_160 + local_f8.cstep * local_f8.elemsize);
    } while (local_170 != (void *)(ulong)(uint)outch);
  }
  iVar17 = inch + 7;
  if (-1 < inch) {
    iVar17 = inch;
  }
  iVar21 = outch + 3;
  if (-1 < outch) {
    iVar21 = outch;
  }
  Mat::create(kernel_tm,iVar17 >> 3,0x24,iVar21 >> 2,0x40,0x20,(Allocator *)0x0);
  if (3 < outch) {
    lVar26 = (long)local_f8.w;
    lVar27 = local_f8.elemsize * local_f8.cstep;
    iVar17 = kernel_tm->w;
    local_a0 = kernel_tm->data;
    sVar14 = kernel_tm->elemsize;
    local_a8 = kernel_tm->cstep * sVar14;
    lVar33 = local_f8.elemsize * lVar26;
    local_b0 = lVar27 * 4;
    lVar23 = lVar33 * 8;
    uVar19 = 0;
    pvVar22 = (void *)((local_f8.cstep * 3 + lVar26) * local_f8.elemsize + (long)local_f8.data);
    pvVar24 = local_f8.data;
    pvVar18 = (void *)(lVar27 * 3 + (long)local_f8.data);
    pvVar28 = (void *)((local_f8.cstep + lVar26) * local_f8.elemsize + (long)local_f8.data);
    pvVar30 = (void *)(lVar27 + (long)local_f8.data);
    pvVar31 = (void *)((lVar26 + local_f8.cstep * 2) * local_f8.elemsize + (long)local_f8.data);
    pvVar32 = (void *)((long)local_f8.data + lVar33);
    pvVar34 = (void *)((long)local_f8.data + lVar27 * 2);
    do {
      local_90 = pvVar34;
      local_80 = pvVar32;
      local_78 = pvVar31;
      local_68 = pvVar30;
      local_60 = pvVar28;
      local_88 = pvVar18;
      local_70 = pvVar22;
      local_98 = uVar19;
      local_158 = 0;
      local_170 = local_80;
      local_160 = local_60;
      local_150 = local_70;
      local_148 = local_78;
      local_140 = local_88;
      local_138 = local_90;
      local_130 = local_68;
      local_128 = pvVar24;
      do {
        if (7 < inch) {
          lVar27 = (long)local_a0 + (long)iVar17 * sVar14 * local_158 + (local_98 >> 2) * local_a8;
          pvVar22 = local_130;
          pvVar18 = local_128;
          lVar26 = 0;
          pvVar28 = local_140;
          pvVar30 = local_138;
          pvVar31 = local_148;
          pvVar32 = local_160;
          pvVar34 = local_170;
          pvVar36 = local_150;
          do {
            lVar20 = 0;
            lVar35 = 0;
            do {
              *(undefined2 *)(lVar27 + lVar35) = *(undefined2 *)((long)pvVar18 + lVar20);
              *(undefined2 *)(lVar27 + lVar35 + 2) = *(undefined2 *)((long)pvVar34 + lVar20);
              *(undefined2 *)(lVar27 + lVar35 + 4) = *(undefined2 *)((long)pvVar22 + lVar20);
              *(undefined2 *)(lVar27 + lVar35 + 6) = *(undefined2 *)((long)pvVar32 + lVar20);
              *(undefined2 *)(lVar27 + lVar35 + 8) = *(undefined2 *)((long)pvVar30 + lVar20);
              *(undefined2 *)(lVar27 + lVar35 + 10) = *(undefined2 *)((long)pvVar31 + lVar20);
              *(undefined2 *)(lVar27 + lVar35 + 0xc) = *(undefined2 *)((long)pvVar28 + lVar20);
              *(undefined2 *)(lVar27 + lVar35 + 0xe) = *(undefined2 *)((long)pvVar36 + lVar20);
              lVar35 = lVar35 + 0x10;
              lVar20 = lVar20 + lVar33 * 2;
            } while (lVar35 != 0x40);
            lVar20 = lVar26 + 0xf;
            pvVar36 = (void *)((long)pvVar36 + lVar23);
            pvVar31 = (void *)((long)pvVar31 + lVar23);
            pvVar32 = (void *)((long)pvVar32 + lVar23);
            pvVar34 = (void *)((long)pvVar34 + lVar23);
            pvVar28 = (void *)((long)pvVar28 + lVar23);
            pvVar30 = (void *)((long)pvVar30 + lVar23);
            pvVar22 = (void *)((long)pvVar22 + lVar23);
            pvVar18 = (void *)((long)pvVar18 + lVar23);
            lVar27 = lVar27 + 0x40;
            lVar26 = lVar26 + 8;
          } while (lVar20 < inch);
        }
        local_158 = local_158 + 1;
        local_150 = (void *)((long)local_150 + 2);
        local_148 = (void *)((long)local_148 + 2);
        local_160 = (void *)((long)local_160 + 2);
        local_170 = (void *)((long)local_170 + 2);
        local_140 = (void *)((long)local_140 + 2);
        local_138 = (void *)((long)local_138 + 2);
        local_130 = (void *)((long)local_130 + 2);
        local_128 = (void *)((long)local_128 + 2);
      } while (local_158 != 0x24);
      pvVar24 = (void *)((long)pvVar24 + local_b0);
      uVar19 = local_98 + 4;
      pvVar22 = (void *)((long)local_70 + local_b0);
      pvVar18 = (void *)((long)local_88 + local_b0);
      pvVar28 = (void *)((long)local_60 + local_b0);
      pvVar30 = (void *)((long)local_68 + local_b0);
      pvVar31 = (void *)((long)local_78 + local_b0);
      pvVar32 = (void *)((long)local_80 + local_b0);
      pvVar34 = (void *)((long)local_90 + local_b0);
    } while (local_98 + 7 < (ulong)(uint)outch);
  }
  piVar16 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar16 != (int *)0x0) {
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        if (local_f8.data != (void *)0x0) {
          free(local_f8.data);
        }
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(kernel, kernel_tm, inch, outch, opt);
}